

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_texture_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Instruction *i,bool sparse,
          bool *forward,SmallVector<unsigned_int,_8UL> *inherited_expressions)

{
  bool *this_00;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  Op op_00;
  uint32_t uVar4;
  uint32_t *puVar5;
  SPIRVariable *pSVar6;
  CompilerError *pCVar7;
  SPIRType *pSVar8;
  SmallVector<unsigned_int,_8UL> *ts_3;
  VariableID *local_348;
  bool local_316;
  bool local_315;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  SPIRVariable *local_218;
  SPIRVariable *image_variable;
  SPIRCombinedImageSampler *pSStack_208;
  VariableID image_id;
  SPIRCombinedImageSampler *combined;
  string local_1f8 [7];
  bool image_is_depth;
  undefined1 auStack_1d8 [8];
  TextureFunctionArguments args;
  uint32_t local_17c;
  string local_178 [4];
  uint32_t sparse_texel_id;
  undefined1 auStack_158 [8];
  TextureFunctionNameArguments name_args;
  undefined1 auStack_128 [8];
  TextureFunctionBaseArguments base_args;
  anon_class_32_4_6bb8ed97 test;
  uint32_t local_e8;
  uint32_t flags;
  uint32_t minlod;
  uint32_t sample;
  uint32_t coffsets;
  uint32_t offset;
  uint32_t coffset;
  uint32_t grad_y;
  uint32_t grad_x;
  uint32_t lod;
  uint32_t bias;
  uint32_t coord_components;
  SPIRType *imgtype;
  SPIRType *type;
  string local_a8;
  ID local_74;
  SPIRType *local_70;
  SPIRType *result_type;
  uint32_t *opt;
  bool nonuniform_expression;
  bool fetch;
  bool proj;
  bool gather;
  uint32_t comp;
  uint32_t dref;
  uint32_t coord;
  VariableID img;
  uint32_t result_type_id;
  uint32_t length;
  Op op;
  uint32_t *ops;
  SmallVector<unsigned_int,_8UL> *inherited_expressions_local;
  bool *forward_local;
  bool sparse_local;
  Instruction *i_local;
  CompilerGLSL *this_local;
  string *expr;
  
  ts_3 = inherited_expressions;
  puVar5 = Compiler::stream(&this->super_Compiler,i);
  op_00 = (Op)i->op;
  img.id = i->length;
  coord = *puVar5;
  TypedID<(spirv_cross::Types)2>::TypedID((TypedID<(spirv_cross::Types)2> *)&dref,puVar5[2]);
  comp = puVar5[3];
  _nonuniform_expression = 0;
  opt._4_4_ = 0;
  opt._3_1_ = 0;
  opt._2_1_ = 0;
  opt._1_1_ = 0;
  opt._0_1_ = 0;
  result_type = (SPIRType *)0x0;
  local_70 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,coord);
  SmallVector<unsigned_int,_8UL>::push_back(inherited_expressions,&comp);
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
            (&local_74,(TypedID<(spirv_cross::Types)2> *)&dref);
  bVar2 = Compiler::has_decoration(&this->super_Compiler,local_74,DecorationNonUniform);
  bVar3 = false;
  if (bVar2) {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&dref);
    pSVar6 = Compiler::maybe_get_backing_variable(&this->super_Compiler,uVar4);
    bVar3 = pSVar6 == (SPIRVariable *)0x0;
  }
  if (bVar3) {
    opt._0_1_ = 1;
  }
  if (op_00 - OpImageSampleDrefImplicitLod < 2) {
LAB_005483f9:
    _nonuniform_expression = puVar5[4];
    result_type = (SPIRType *)(puVar5 + 5);
    img.id = img.id - 5;
  }
  else if (op_00 - OpImageSampleProjImplicitLod < 2) {
LAB_0054875d:
    result_type = (SPIRType *)(puVar5 + 4);
    img.id = img.id - 4;
    opt._2_1_ = 1;
  }
  else if (op_00 - OpImageSampleProjDrefImplicitLod < 2) {
LAB_0054841d:
    _nonuniform_expression = puVar5[4];
    result_type = (SPIRType *)(puVar5 + 5);
    img.id = img.id - 5;
    opt._2_1_ = 1;
  }
  else if (op_00 == OpImageFetch) {
LAB_00548742:
    result_type = (SPIRType *)(puVar5 + 4);
    img.id = img.id - 4;
    opt._1_1_ = 1;
  }
  else if (op_00 == OpImageGather) {
LAB_0054856d:
    opt._4_4_ = puVar5[4];
    result_type = (SPIRType *)(puVar5 + 5);
    img.id = img.id - 5;
    opt._3_1_ = 1;
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x136)) {
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar7,"textureGather requires ESSL 310.");
      __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 400)) {
      bVar3 = expression_is_constant_null(this,opt._4_4_);
      if (!bVar3) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar7,"textureGather with component requires GLSL 400.");
        __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_a8,"GL_ARB_texture_gather",(allocator *)((long)&type + 7));
      require_extension_internal(this,&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&type + 7));
    }
  }
  else {
    if (op_00 != OpImageDrefGather) {
      if (op_00 != OpImageRead) {
        if (op_00 - OpImageSparseSampleDrefImplicitLod < 2) goto LAB_005483f9;
        if (op_00 - OpImageSparseSampleProjImplicitLod < 2) goto LAB_0054875d;
        if (op_00 - OpImageSparseSampleProjDrefImplicitLod < 2) goto LAB_0054841d;
        if (op_00 != OpImageSparseFetch) {
          if (op_00 == OpImageSparseGather) goto LAB_0054856d;
          if (op_00 == OpImageSparseDrefGather) goto LAB_00548445;
          result_type = (SPIRType *)(puVar5 + 4);
          img.id = img.id - 4;
          goto LAB_0054878d;
        }
      }
      goto LAB_00548742;
    }
LAB_00548445:
    _nonuniform_expression = puVar5[4];
    result_type = (SPIRType *)(puVar5 + 5);
    img.id = img.id - 5;
    opt._3_1_ = 1;
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x136)) {
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar7,"textureGather requires ESSL 310.");
      __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 400)) {
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar7,"textureGather with depth compare requires GLSL 400.");
      __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
  }
LAB_0054878d:
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&dref);
  imgtype = Compiler::expression_type(&this->super_Compiler,uVar4);
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(imgtype->super_IVariant).self);
  _bias = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar4);
  switch((_bias->image).dim) {
  case Dim1D:
    lod = 1;
    break;
  case Dim2D:
    lod = 2;
    break;
  case Dim3D:
    lod = 3;
    break;
  case Cube:
    lod = 3;
    break;
  default:
    lod = 2;
    break;
  case Buffer:
    lod = 1;
  }
  if (_nonuniform_expression != 0) {
    SmallVector<unsigned_int,_8UL>::push_back(inherited_expressions,(uint *)&nonuniform_expression);
  }
  if ((opt._2_1_ & 1) != 0) {
    lod = lod + 1;
  }
  if (((_bias->image).arrayed & 1U) != 0) {
    lod = lod + 1;
  }
  grad_x = 0;
  grad_y = 0;
  coffset = 0;
  offset = 0;
  coffsets = 0;
  sample = 0;
  minlod = 0;
  flags = 0;
  local_e8 = 0;
  test.inherited_expressions._4_4_ = 0;
  if (img.id != 0) {
    test.inherited_expressions._4_4_ = *(undefined4 *)&(result_type->super_IVariant)._vptr_IVariant;
    img.id = img.id - 1;
    result_type = (SPIRType *)((long)&(result_type->super_IVariant)._vptr_IVariant + 4);
  }
  base_args._16_8_ = &img;
  test.length = (uint32_t *)((long)&test.inherited_expressions + 4);
  test.flags = (uint32_t *)&result_type;
  this_00 = &base_args.is_fetch;
  test.opt = (uint32_t **)inherited_expressions;
  to_texture_op::anon_class_32_4_6bb8ed97::operator()((anon_class_32_4_6bb8ed97 *)this_00,&grad_x,1)
  ;
  to_texture_op::anon_class_32_4_6bb8ed97::operator()((anon_class_32_4_6bb8ed97 *)this_00,&grad_y,2)
  ;
  to_texture_op::anon_class_32_4_6bb8ed97::operator()
            ((anon_class_32_4_6bb8ed97 *)this_00,&coffset,4);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()((anon_class_32_4_6bb8ed97 *)this_00,&offset,4)
  ;
  to_texture_op::anon_class_32_4_6bb8ed97::operator()
            ((anon_class_32_4_6bb8ed97 *)this_00,&coffsets,8);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()
            ((anon_class_32_4_6bb8ed97 *)this_00,&sample,0x10);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()
            ((anon_class_32_4_6bb8ed97 *)this_00,&minlod,0x20);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()
            ((anon_class_32_4_6bb8ed97 *)this_00,&flags,0x40);
  to_texture_op::anon_class_32_4_6bb8ed97::operator()
            ((anon_class_32_4_6bb8ed97 *)this_00,&local_e8,0x80);
  auStack_128 = (undefined1  [8])0x0;
  base_args.img.id = 0;
  base_args._4_4_ = 0;
  base_args.imgtype = (SPIRType *)0x0;
  TextureFunctionBaseArguments::TextureFunctionBaseArguments
            ((TextureFunctionBaseArguments *)auStack_128);
  auStack_128._0_4_ = dref;
  base_args._0_8_ = _bias;
  base_args.imgtype = (SPIRType *)(CONCAT71(base_args.imgtype._1_7_,opt._1_1_) & 0xffffffffffffff01)
  ;
  base_args.imgtype =
       (SPIRType *)
       (CONCAT62(base_args.imgtype._2_6_,CONCAT11(opt._3_1_,base_args.imgtype._0_1_)) &
       0xffffffffffff01ff);
  base_args.imgtype =
       (SPIRType *)
       (CONCAT53(base_args.imgtype._3_5_,CONCAT12(opt._2_1_,base_args.imgtype._0_2_)) &
       0xffffffffff01ffff);
  name_args._39_1_ = 0;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  name_args.base.imgtype = (SPIRType *)0x0;
  name_args.base.is_fetch = false;
  name_args.base.is_gather = false;
  name_args.base.is_proj = false;
  name_args.base._19_5_ = 0;
  auStack_158 = (undefined1  [8])0x0;
  name_args.base.img.id = 0;
  name_args.base._4_4_ = 0;
  name_args.has_array_offsets = false;
  name_args.has_offset = false;
  name_args.has_grad = false;
  name_args.has_dref = false;
  name_args.is_sparse_feedback = false;
  name_args.has_min_lod = false;
  name_args._30_2_ = 0;
  TextureFunctionNameArguments::TextureFunctionNameArguments
            ((TextureFunctionNameArguments *)auStack_158);
  uVar1 = name_args.base._16_8_;
  auStack_158 = auStack_128;
  name_args.base.img.id = base_args.img.id;
  name_args.base._4_4_ = base_args._4_4_;
  name_args.base.imgtype._0_3_ = SUB83(base_args.imgtype,0);
  local_315 = coffsets != 0 || sample != 0;
  name_args.base.is_gather = local_315;
  name_args.base.is_fetch = minlod != 0;
  local_316 = coffset != 0 || offset != 0;
  name_args.base.is_proj = local_316;
  name_args.base._19_1_ = _nonuniform_expression != 0;
  name_args.base._20_1_ = sparse;
  name_args.base._22_2_ = SUB82(uVar1,6);
  name_args.base._21_1_ = local_e8 != 0;
  name_args.has_array_offsets = (bool)(undefined1)grad_y;
  name_args.has_offset = (bool)grad_y._1_1_;
  name_args.has_grad = (bool)grad_y._2_1_;
  name_args.has_dref = (bool)grad_y._3_1_;
  (*(this->super_Compiler)._vptr_Compiler[0x1e])(local_178,this,auStack_158);
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_178);
  ::std::__cxx11::string::~string(local_178);
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
  local_17c = 0;
  if (sparse) {
    local_17c = get_sparse_feedback_texel_id(this,puVar5[1]);
  }
  args.component = 0;
  args.sample = 0;
  args.sparse_texel = 0;
  args.min_lod = 0;
  args.grad_y = 0;
  args.lod = 0;
  args.offset = 0;
  args.bias = 0;
  args.coord = 0;
  args.coord_components = 0;
  args.dref = 0;
  args.grad_x = 0;
  args.base.imgtype = (SPIRType *)0x0;
  args.base.is_fetch = false;
  args.base.is_gather = false;
  args.base.is_proj = false;
  args.base._19_5_ = 0;
  auStack_1d8 = (undefined1  [8])0x0;
  args.base.img.id = 0;
  args.base._4_4_ = 0;
  TextureFunctionArguments::TextureFunctionArguments((TextureFunctionArguments *)auStack_1d8);
  auStack_1d8 = auStack_128;
  args.base.img.id = base_args.img.id;
  args.base._4_4_ = base_args._4_4_;
  args.base.imgtype._0_3_ = SUB83(base_args.imgtype,0);
  args.base._20_4_ = lod;
  args.base.is_fetch = (bool)(undefined1)comp;
  args.base.is_gather = (bool)comp._1_1_;
  args.base.is_proj = (bool)comp._2_1_;
  args.base._19_1_ = comp._3_1_;
  args.coord_components = coffset;
  args.coord = _nonuniform_expression;
  args.grad_x = grad_y;
  args.dref = offset;
  args.grad_y = minlod;
  if ((minlod == 0) && (args.grad_y = sample, coffsets != 0)) {
    args.grad_y = coffsets;
  }
  args.lod = grad_x;
  args.bias = flags;
  args.offset = opt._4_4_;
  args.sample = local_e8;
  args.component = local_17c;
  args._64_8_ = CONCAT71(CONCAT61(args._66_6_,minlod != 0),opt._0_1_) & 0xffffffffffffff01;
  (*(this->super_Compiler)._vptr_Compiler[0x1f])(local_1f8,this,auStack_1d8,forward);
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_1f8);
  ::std::__cxx11::string::~string(local_1f8);
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  bVar3 = is_legacy(this);
  pSVar8 = _bias;
  if ((bVar3) && (((this->options).es & 1U) == 0)) {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&dref);
    bVar3 = Compiler::is_depth_image(&this->super_Compiler,pSVar8,uVar4);
    if (bVar3) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".r");
    }
  }
  if ((((this->backend).comparison_image_samples_scalar & 1U) == 0) ||
     (bVar3 = image_opcode_is_sample_no_dref(op_00), !bVar3)) goto LAB_00549140;
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&dref);
  pSStack_208 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>
                          (&this->super_Compiler,uVar4);
  pSVar8 = _bias;
  if (pSStack_208 == (SPIRCombinedImageSampler *)0x0) {
    local_348 = (VariableID *)&dref;
  }
  else {
    local_348 = &pSStack_208->image;
  }
  image_variable._4_4_ = local_348->id;
  if (pSStack_208 == (SPIRCombinedImageSampler *)0x0) {
LAB_00548fd6:
    pSVar8 = _bias;
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&dref);
    combined._7_1_ = Compiler::is_depth_image(&this->super_Compiler,pSVar8,uVar4);
  }
  else {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_208->image);
    bVar3 = Compiler::is_depth_image(&this->super_Compiler,pSVar8,uVar4);
    if (!bVar3) goto LAB_00548fd6;
    combined._7_1_ = true;
  }
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&image_variable + 4));
  local_218 = Compiler::maybe_get_backing_variable(&this->super_Compiler,uVar4);
  if (local_218 != (SPIRVariable *)0x0) {
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(local_218->super_IVariant).field_0xc);
    pSVar8 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar4);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_218->super_IVariant).self);
    bVar3 = Compiler::is_depth_image(&this->super_Compiler,pSVar8,uVar4);
    if (bVar3) {
      combined._7_1_ = true;
    }
  }
  if (combined._7_1_ != false) {
    remap_swizzle(&local_238,this,local_70,1,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_238);
    ::std::__cxx11::string::~string((string *)&local_238);
  }
LAB_00549140:
  if (((!sparse) && (((this->backend).support_small_type_sampling_result & 1U) == 0)) &&
     (local_70->width < 0x20)) {
    type_to_glsl_constructor_abi_cxx11_(&local_278,this,local_70);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_258,(spirv_cross *)&local_278,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60,
               (char (*) [2])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
               (char (*) [2])ts_3);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_258);
    ::std::__cxx11::string::~string((string *)&local_258);
    ::std::__cxx11::string::~string((string *)&local_278);
  }
  if (op_00 == OpImageRead) {
    remap_swizzle(&local_298,this,local_70,4,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_298);
    ::std::__cxx11::string::~string((string *)&local_298);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::to_texture_op(const Instruction &i, bool sparse, bool *forward,
                                        SmallVector<uint32_t> &inherited_expressions)
{
	auto *ops = stream(i);
	auto op = static_cast<Op>(i.op);
	uint32_t length = i.length;

	uint32_t result_type_id = ops[0];
	VariableID img = ops[2];
	uint32_t coord = ops[3];
	uint32_t dref = 0;
	uint32_t comp = 0;
	bool gather = false;
	bool proj = false;
	bool fetch = false;
	bool nonuniform_expression = false;
	const uint32_t *opt = nullptr;

	auto &result_type = get<SPIRType>(result_type_id);

	inherited_expressions.push_back(coord);
	if (has_decoration(img, DecorationNonUniform) && !maybe_get_backing_variable(img))
		nonuniform_expression = true;

	switch (op)
	{
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleDrefExplicitLod:
	case OpImageSparseSampleDrefImplicitLod:
	case OpImageSparseSampleDrefExplicitLod:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		break;

	case OpImageSampleProjDrefImplicitLod:
	case OpImageSampleProjDrefExplicitLod:
	case OpImageSparseSampleProjDrefImplicitLod:
	case OpImageSparseSampleProjDrefExplicitLod:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		proj = true;
		break;

	case OpImageDrefGather:
	case OpImageSparseDrefGather:
		dref = ops[4];
		opt = &ops[5];
		length -= 5;
		gather = true;
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("textureGather requires ESSL 310.");
		else if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("textureGather with depth compare requires GLSL 400.");
		break;

	case OpImageGather:
	case OpImageSparseGather:
		comp = ops[4];
		opt = &ops[5];
		length -= 5;
		gather = true;
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("textureGather requires ESSL 310.");
		else if (!options.es && options.version < 400)
		{
			if (!expression_is_constant_null(comp))
				SPIRV_CROSS_THROW("textureGather with component requires GLSL 400.");
			require_extension_internal("GL_ARB_texture_gather");
		}
		break;

	case OpImageFetch:
	case OpImageSparseFetch:
	case OpImageRead: // Reads == fetches in Metal (other langs will not get here)
		opt = &ops[4];
		length -= 4;
		fetch = true;
		break;

	case OpImageSampleProjImplicitLod:
	case OpImageSampleProjExplicitLod:
	case OpImageSparseSampleProjImplicitLod:
	case OpImageSparseSampleProjExplicitLod:
		opt = &ops[4];
		length -= 4;
		proj = true;
		break;

	default:
		opt = &ops[4];
		length -= 4;
		break;
	}

	// Bypass pointers because we need the real image struct
	auto &type = expression_type(img);
	auto &imgtype = get<SPIRType>(type.self);

	uint32_t coord_components = 0;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		coord_components = 1;
		break;
	case spv::Dim2D:
		coord_components = 2;
		break;
	case spv::Dim3D:
		coord_components = 3;
		break;
	case spv::DimCube:
		coord_components = 3;
		break;
	case spv::DimBuffer:
		coord_components = 1;
		break;
	default:
		coord_components = 2;
		break;
	}

	if (dref)
		inherited_expressions.push_back(dref);

	if (proj)
		coord_components++;
	if (imgtype.image.arrayed)
		coord_components++;

	uint32_t bias = 0;
	uint32_t lod = 0;
	uint32_t grad_x = 0;
	uint32_t grad_y = 0;
	uint32_t coffset = 0;
	uint32_t offset = 0;
	uint32_t coffsets = 0;
	uint32_t sample = 0;
	uint32_t minlod = 0;
	uint32_t flags = 0;

	if (length)
	{
		flags = *opt++;
		length--;
	}

	auto test = [&](uint32_t &v, uint32_t flag) {
		if (length && (flags & flag))
		{
			v = *opt++;
			inherited_expressions.push_back(v);
			length--;
		}
	};

	test(bias, ImageOperandsBiasMask);
	test(lod, ImageOperandsLodMask);
	test(grad_x, ImageOperandsGradMask);
	test(grad_y, ImageOperandsGradMask);
	test(coffset, ImageOperandsConstOffsetMask);
	test(offset, ImageOperandsOffsetMask);
	test(coffsets, ImageOperandsConstOffsetsMask);
	test(sample, ImageOperandsSampleMask);
	test(minlod, ImageOperandsMinLodMask);

	TextureFunctionBaseArguments base_args = {};
	base_args.img = img;
	base_args.imgtype = &imgtype;
	base_args.is_fetch = fetch != 0;
	base_args.is_gather = gather != 0;
	base_args.is_proj = proj != 0;

	string expr;
	TextureFunctionNameArguments name_args = {};

	name_args.base = base_args;
	name_args.has_array_offsets = coffsets != 0;
	name_args.has_offset = coffset != 0 || offset != 0;
	name_args.has_grad = grad_x != 0 || grad_y != 0;
	name_args.has_dref = dref != 0;
	name_args.is_sparse_feedback = sparse;
	name_args.has_min_lod = minlod != 0;
	name_args.lod = lod;
	expr += to_function_name(name_args);
	expr += "(";

	uint32_t sparse_texel_id = 0;
	if (sparse)
		sparse_texel_id = get_sparse_feedback_texel_id(ops[1]);

	TextureFunctionArguments args = {};
	args.base = base_args;
	args.coord = coord;
	args.coord_components = coord_components;
	args.dref = dref;
	args.grad_x = grad_x;
	args.grad_y = grad_y;
	args.lod = lod;
	args.has_array_offsets = coffsets != 0;

	if (coffsets)
		args.offset = coffsets;
	else if (coffset)
		args.offset = coffset;
	else
		args.offset = offset;

	args.bias = bias;
	args.component = comp;
	args.sample = sample;
	args.sparse_texel = sparse_texel_id;
	args.min_lod = minlod;
	args.nonuniform_expression = nonuniform_expression;
	expr += to_function_args(args, forward);
	expr += ")";

	// texture(samplerXShadow) returns float. shadowX() returns vec4, but only in desktop GLSL. Swizzle here.
	if (is_legacy() && !options.es && is_depth_image(imgtype, img))
		expr += ".r";

	// Sampling from a texture which was deduced to be a depth image, might actually return 1 component here.
	// Remap back to 4 components as sampling opcodes expect.
	if (backend.comparison_image_samples_scalar && image_opcode_is_sample_no_dref(op))
	{
		bool image_is_depth = false;
		const auto *combined = maybe_get<SPIRCombinedImageSampler>(img);
		VariableID image_id = combined ? combined->image : img;

		if (combined && is_depth_image(imgtype, combined->image))
			image_is_depth = true;
		else if (is_depth_image(imgtype, img))
			image_is_depth = true;

		// We must also check the backing variable for the image.
		// We might have loaded an OpImage, and used that handle for two different purposes.
		// Once with comparison, once without.
		auto *image_variable = maybe_get_backing_variable(image_id);
		if (image_variable && is_depth_image(get<SPIRType>(image_variable->basetype), image_variable->self))
			image_is_depth = true;

		if (image_is_depth)
			expr = remap_swizzle(result_type, 1, expr);
	}

	if (!sparse && !backend.support_small_type_sampling_result && result_type.width < 32)
	{
		// Just value cast (narrowing) to expected type since we cannot rely on narrowing to work automatically.
		// Hopefully compiler picks this up and converts the texturing instruction to the appropriate precision.
		expr = join(type_to_glsl_constructor(result_type), "(", expr, ")");
	}

	// Deals with reads from MSL. We might need to downconvert to fewer components.
	if (op == OpImageRead)
		expr = remap_swizzle(result_type, 4, expr);

	return expr;
}